

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

int If_CutDsdBalanceEval_rec
              (If_DsdMan_t *p,int Id,int *pTimes,int *pnSupp,Vec_Int_t *vAig,int *piLit,int nSuppAll
              ,int *pArea,char *pPermLits)

{
  char cVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint fXor;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  undefined8 local_c8;
  ulong local_c0;
  int pFaninLits [15];
  int pCounter [15];
  
  if ((Id < 0) || ((p->vObjs).nSize <= Id)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  piVar2 = (int *)(p->vObjs).pArray[(uint)Id];
  switch(piVar2[1] & 7U) {
  case 2:
    cVar1 = pPermLits[*pnSupp];
    if (cVar1 < '\0') {
LAB_003941a3:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10c,"int Abc_Lit2Var(int)");
    }
    if (vAig != (Vec_Int_t *)0x0) {
      *piLit = (int)cVar1;
    }
    *pnSupp = *pnSupp + 1;
    iVar6 = pTimes[(uint)(int)cVar1 >> 1];
    break;
  case 3:
  case 4:
    fXor = (uint)((piVar2[1] & 7U) == 4);
    uVar5 = (uint)piVar2[1] >> 0x1b;
    uVar15 = 0;
    if ((uint)piVar2[1] < 0x8000000) {
      iVar6 = 0;
      uVar15 = 0;
    }
    else {
      uVar8 = piVar2[2];
      iVar6 = 0;
      local_c8 = p;
      if (uVar8 != 0) {
        uVar15 = 0;
        uVar13 = 0;
        do {
          local_c0 = uVar13;
          if ((int)uVar8 < 0) goto LAB_003941a3;
          iVar6 = If_CutDsdBalanceEval_rec
                            (local_c8,uVar8 >> 1,pTimes,pnSupp,vAig,pFaninLits + uVar13,nSuppAll,
                             pArea,pPermLits);
          if (iVar6 == -1) {
            return -1;
          }
          if (vAig == (Vec_Int_t *)0x0) {
            uVar5 = 0xffffffff;
          }
          else {
            if (pFaninLits[local_c0] < 0) {
LAB_003941e1:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10f,"int Abc_LitNotCond(int, int)");
            }
            uVar5 = pFaninLits[local_c0] ^ uVar8 & 1;
            pFaninLits[local_c0] = uVar5;
          }
          uVar13 = (ulong)(int)uVar15;
          if (vAig != (Vec_Int_t *)0x0) {
            pFaninLits[uVar13] = uVar5;
          }
          uVar5 = uVar15 + 1;
          pCounter[uVar13] = iVar6;
          bVar4 = 0 < (int)uVar15;
          uVar15 = uVar5;
          if (bVar4) {
            do {
              uVar14 = uVar13 & 0xffffffff;
              iVar6 = pCounter[uVar14];
              uVar11 = uVar13 - 1 & 0xffffffff;
              iVar7 = pCounter[uVar11];
              if (iVar6 < iVar7) break;
              iVar12 = (int)uVar13;
              if (iVar7 < iVar6) {
                pCounter[uVar14] = iVar7;
                pCounter[uVar11] = iVar6;
                if (vAig != (Vec_Int_t *)0x0) {
                  iVar6 = pFaninLits[uVar14];
                  pFaninLits[uVar14] = pFaninLits[uVar11];
                  pFaninLits[uVar11] = iVar6;
                }
              }
              else {
                pCounter[uVar11] = iVar7 + 1;
                if (vAig != (Vec_Int_t *)0x0) {
                  iVar6 = If_LogCreateAndXor(vAig,pFaninLits[uVar14],pFaninLits[uVar11],nSuppAll,
                                             fXor);
                  pFaninLits[uVar11] = iVar6;
                }
                uVar15 = uVar15 - 1;
                if (iVar12 < (int)uVar15) {
                  lVar10 = 0;
                  do {
                    pCounter[uVar14 + lVar10] = pCounter[uVar14 + lVar10 + 1];
                    if (vAig != (Vec_Int_t *)0x0) {
                      pFaninLits[uVar14 + lVar10] = pFaninLits[uVar14 + lVar10 + 1];
                    }
                    lVar10 = lVar10 + 1;
                  } while ((int)lVar10 + iVar12 < (int)uVar15);
                }
              }
              uVar13 = uVar13 - 1;
            } while (1 < iVar12);
          }
          if ((int)uVar15 < 1) {
            __assert_fail("nTimes > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCount.h"
                          ,0x77,
                          "int If_LogCounterAddAig(int *, int *, int *, int, int, Vec_Int_t *, int, int, int)"
                         );
          }
          uVar13 = local_c0 + 1;
          uVar5 = (uint)piVar2[1] >> 0x1b;
        } while ((uVar13 < uVar5) && (uVar8 = piVar2[local_c0 + 3], uVar8 != 0));
        iVar6 = pCounter[0] + (uint)(uVar15 != 1);
      }
    }
    if ((int)uVar15 < 1) {
      __assert_fail("nCounter > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                    ,0x8fa,
                    "int If_CutDsdBalanceEval_rec(If_DsdMan_t *, int, int *, int *, Vec_Int_t *, int *, int, int *, char *)"
                   );
    }
    if (vAig == (Vec_Int_t *)0x0) {
      *pArea = uVar5 + *pArea + -1;
    }
    else {
      if (uVar15 != 1) {
        lVar10 = (ulong)uVar15 + 1;
        do {
          iVar7 = If_LogCreateAndXor(vAig,pFaninLits[lVar10 + -2],
                                     *(int *)((long)&local_c8 + lVar10 * 4 + 4),nSuppAll,fXor);
          *(int *)((long)&local_c8 + lVar10 * 4 + 4) = iVar7;
          lVar10 = lVar10 + -1;
        } while (2 < lVar10);
      }
      *piLit = pFaninLits[0];
    }
    break;
  case 5:
    if (0x7ffffff < (uint)piVar2[1]) {
      puVar9 = (uint *)pFaninLits;
      uVar13 = 0;
      do {
        uVar15 = piVar2[uVar13 + 2];
        if (uVar15 == 0) break;
        if ((int)uVar15 < 0) goto LAB_003941a3;
        iVar6 = If_CutDsdBalanceEval_rec
                          (p,uVar15 >> 1,pTimes,pnSupp,vAig,(int *)puVar9,nSuppAll,pArea,pPermLits);
        pCounter[uVar13] = iVar6;
        if (iVar6 == -1) {
          return -1;
        }
        if (vAig != (Vec_Int_t *)0x0) {
          if ((int)*puVar9 < 0) goto LAB_003941e1;
          *puVar9 = *puVar9 ^ uVar15 & 1;
        }
        uVar13 = uVar13 + 1;
        puVar9 = puVar9 + 1;
      } while (uVar13 < (uint)piVar2[1] >> 0x1b);
    }
    if (vAig == (Vec_Int_t *)0x0) {
      *pArea = *pArea + 3;
    }
    else {
      iVar6 = If_LogCreateMux(vAig,pFaninLits[0],pFaninLits[1],pFaninLits[2],nSuppAll);
      *piLit = iVar6;
    }
    if (pCounter[2] < pCounter[1]) {
      pCounter[2] = pCounter[1];
    }
    if (pCounter[2] < pCounter[0]) {
      pCounter[2] = pCounter[0];
    }
    iVar6 = pCounter[2] + 2;
    break;
  case 6:
    uVar15 = piVar2[1];
    uVar5 = 0xffffffff;
    if (0x17ffffff < uVar15 && (uVar15 & 7) == 6) {
      iVar6 = *piVar2;
      if (((long)iVar6 < 0) || ((p->vTruths).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar5 = (p->vTruths).pArray[iVar6];
    }
    if (((int)uVar5 < 0) || (p->vIsops[uVar15 >> 0x1b]->nSize <= (int)uVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    pVVar3 = p->vIsops[uVar15 >> 0x1b]->pArray;
    iVar6 = -1;
    if (pVVar3[uVar5].nSize != 0) {
      local_c8 = p;
      if (0x7ffffff < (uint)piVar2[1]) {
        puVar9 = (uint *)pFaninLits;
        uVar13 = 0;
        do {
          uVar15 = piVar2[uVar13 + 2];
          if (uVar15 == 0) break;
          if ((int)uVar15 < 0) goto LAB_003941a3;
          iVar6 = If_CutDsdBalanceEval_rec
                            (local_c8,uVar15 >> 1,pTimes,pnSupp,vAig,(int *)puVar9,nSuppAll,pArea,
                             pPermLits);
          pCounter[uVar13] = iVar6;
          if (iVar6 == -1) {
            return -1;
          }
          if (vAig != (Vec_Int_t *)0x0) {
            if ((int)*puVar9 < 0) goto LAB_003941e1;
            *puVar9 = *puVar9 ^ uVar15 & 1;
          }
          uVar13 = uVar13 + 1;
          puVar9 = puVar9 + 1;
        } while (uVar13 < (uint)piVar2[1] >> 0x1b);
      }
      iVar6 = If_CutSopBalanceEvalInt(pVVar3 + uVar5,pCounter,pFaninLits,vAig,piLit,nSuppAll,pArea);
    }
    break;
  default:
    __assert_fail("If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                  ,0x8eb,
                  "int If_CutDsdBalanceEval_rec(If_DsdMan_t *, int, int *, int *, Vec_Int_t *, int *, int, int *, char *)"
                 );
  }
  return iVar6;
}

Assistant:

int If_CutDsdBalanceEval_rec( If_DsdMan_t * p, int Id, int * pTimes, int * pnSupp, Vec_Int_t * vAig, int * piLit, int nSuppAll, int * pArea, char * pPermLits )
{
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iCutVar = Abc_Lit2Var( pPermLits[*pnSupp] );
        if ( vAig ) 
            *piLit = Abc_Var2Lit( iCutVar, Abc_LitIsCompl(pPermLits[*pnSupp]) );
        (*pnSupp)++;
        return pTimes[iCutVar];
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        int i, iFanin, Delays[3], pFaninLits[3];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delays[i] = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delays[i] == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
        }
        if ( vAig )
            *piLit = If_LogCreateMux( vAig, pFaninLits[0], pFaninLits[1], pFaninLits[2], nSuppAll );
        else
            *pArea += 3;
        return 2 + Abc_MaxInt(Delays[0], Abc_MaxInt(Delays[1], Delays[2]));
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
    {
        int i, iFanin, Delays[IF_MAX_FUNC_LUTSIZE], pFaninLits[IF_MAX_FUNC_LUTSIZE];
        Vec_Int_t * vCover = Vec_WecEntry( p->vIsops[pObj->nFans], If_DsdObjTruthId(p, pObj) );
        if ( Vec_IntSize(vCover) == 0 )
            return -1;
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delays[i] = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delays[i] == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
        }
        return If_CutSopBalanceEvalInt( vCover, Delays, pFaninLits, vAig, piLit, nSuppAll, pArea );
    }
    assert( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR );
    {
        int i, iFanin, Delay, Result = 0;
        int fXor = 0;//(If_DsdObjType(pObj) == IF_DSD_XOR);
        int fXorFunc = (If_DsdObjType(pObj) == IF_DSD_XOR);
        int nCounter = 0, pCounter[IF_MAX_FUNC_LUTSIZE], pFaninLits[IF_MAX_FUNC_LUTSIZE];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delay = If_CutDsdBalanceEval_rec( p, Abc_Lit2Var(iFanin), pTimes, pnSupp, vAig, pFaninLits+i, nSuppAll, pArea, pPermLits );
            if ( Delay == -1 )
                return -1;
            if ( vAig ) 
                pFaninLits[i] = Abc_LitNotCond( pFaninLits[i], Abc_LitIsCompl(iFanin) );
            Result = If_LogCounterAddAig( pCounter, &nCounter, pFaninLits, Delay, vAig ? pFaninLits[i] : -1, vAig, nSuppAll, fXor, fXorFunc );
        }
        assert( nCounter > 0 );
        if ( fXor )
            Result = If_LogCounterDelayXor( pCounter, nCounter ); // estimation
        if ( vAig )
            *piLit = If_LogCreateAndXorMulti( vAig, pFaninLits, nCounter, nSuppAll, fXorFunc );
        else
            *pArea += (pObj->nFans - 1) * (1 + 2 * fXor);
        return Result;
    }
}